

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O0

int GetPWMSSC32(SSC32 *pSSC32,int channel,int *pPw)

{
  int iVar1;
  size_t sVar2;
  unsigned_short pw;
  int recvbuflen;
  uint8 local_228 [2];
  char recvbuf [2];
  int sendbuflen;
  char sendbuf [512];
  int *pPw_local;
  int channel_local;
  SSC32 *pSSC32_local;
  
  recvbuflen = 0;
  memset(local_228,0,0x200);
  sprintf((char *)local_228,"#%dPI\r",(ulong)(uint)channel);
  sVar2 = strlen((char *)local_228);
  recvbuflen = (int)sVar2;
  iVar1 = WriteDataSSC32(pSSC32,local_228,recvbuflen,pSSC32->bytedelayus);
  if (iVar1 == 0) {
    if ((pSSC32->bSaveRawData != 0) && (pSSC32->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_228,(long)recvbuflen,1,(FILE *)pSSC32->pfSaveFile);
      fflush((FILE *)pSSC32->pfSaveFile);
    }
    memset(&pw,0,2);
    iVar1 = ReadAllRS232Port(&pSSC32->RS232Port,(uint8 *)&pw,2);
    if (iVar1 == 0) {
      if ((pSSC32->bSaveRawData != 0) && (pSSC32->pfSaveFile != (FILE *)0x0)) {
        fwrite(&pw,2,1,(FILE *)pSSC32->pfSaveFile);
        fflush((FILE *)pSSC32->pfSaveFile);
      }
      *pPw = (uint)pw;
      pSSC32_local._4_4_ = 0;
    }
    else {
      printf("Error reading data from a SSC32. \n");
      pSSC32_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a SSC32. \n");
    pSSC32_local._4_4_ = 1;
  }
  return pSSC32_local._4_4_;
}

Assistant:

inline int GetPWMSSC32(SSC32* pSSC32, int channel, int* pPw)
{
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;
	char recvbuf[2];
	int recvbuflen = 0;
	unsigned short pw = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "#%dPI\r", channel);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}
	
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 2;

	if (ReadAllRS232Port(&pSSC32->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	// pw in us as a 16 bit integer.
	memcpy((char*)&pw, recvbuf, sizeof(unsigned short));
	*pPw = pw;

	return EXIT_SUCCESS;
}